

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double find_double(var *element,string *name,string *desired_units,string *default_units,
                  double default_value)

{
  double value;
  bool bVar1;
  var *pvVar2;
  string units;
  double local_88;
  string local_80;
  string local_60;
  string local_40 [32];
  
  pvVar2 = find(name,element);
  bVar1 = std::operator==(&pvVar2->units,"#");
  if (!bVar1) {
    default_units = &pvVar2->units;
  }
  std::__cxx11::string::string(local_40,(string *)default_units);
  value = pvVar2->value;
  if ((value != 0.0) || (local_88 = default_value, NAN(value))) {
    std::__cxx11::string::string((string *)&local_60,local_40);
    std::__cxx11::string::string((string *)&local_80,(string *)desired_units);
    local_88 = convert_units(value,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string(local_40);
  return local_88;
}

Assistant:

double find_double(var * element, const string & name, const string & desired_units, string default_units = "",
        double default_value = 0.0) {
    var * current = find(name, element);
    string units = current->units == "#" ? default_units : current->units;

    if (current->value == 0) {
        return default_value;
    } else {
        return convert_units(current->value, units, desired_units);
    }
}